

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_start__jack(ma_device *pDevice)

{
  ma_context *pmVar1;
  undefined8 uVar2;
  int iVar3;
  ma_result mVar4;
  long lVar5;
  undefined8 uVar6;
  char *pClientPort_1;
  char *pServerPort_1;
  char **ppServerPorts_1;
  char *pClientPort;
  char *pServerPort;
  char **ppServerPorts;
  size_t i;
  int resultJACK;
  ma_context *pContext;
  ma_device *pDevice_local;
  
  pmVar1 = pDevice->pContext;
  iVar3 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
  if (iVar3 == 0) {
    if ((pDevice->type == ma_device_type_capture) || (pDevice->type == ma_device_type_duplex)) {
      lVar5 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                        ((pDevice->field_23).alsa.pPCMPlayback,0,"32 bit float mono audio",6);
      if (lVar5 == 0) {
        (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                  ((pDevice->field_23).alsa.pPCMPlayback);
        mVar4 = ma_post_error(pDevice,1,"[JACK] Failed to retrieve physical ports.",-1);
        return mVar4;
      }
      for (ppServerPorts = (char **)0x0; *(long *)(lVar5 + (long)ppServerPorts * 8) != 0;
          ppServerPorts = (char **)((long)ppServerPorts + 1)) {
        uVar2 = *(undefined8 *)(lVar5 + (long)ppServerPorts * 8);
        uVar6 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_format)
                          (*(undefined8 *)
                            ((long)&pDevice->field_23 + (long)ppServerPorts * 8 + 0x108));
        iVar3 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                          ((pDevice->field_23).alsa.pPCMPlayback,uVar2,uVar6);
        if (iVar3 != 0) {
          (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
          (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
          mVar4 = ma_post_error(pDevice,1,"[JACK] Failed to connect ports.",-1);
          return mVar4;
        }
      }
      (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
    }
    if ((pDevice->type == ma_device_type_playback) || (pDevice->type == ma_device_type_duplex)) {
      lVar5 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
                        ((pDevice->field_23).alsa.pPCMPlayback,0,"32 bit float mono audio",5);
      if (lVar5 == 0) {
        (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                  ((pDevice->field_23).alsa.pPCMPlayback);
        mVar4 = ma_post_error(pDevice,1,"[JACK] Failed to retrieve physical ports.",-1);
        return mVar4;
      }
      for (ppServerPorts = (char **)0x0; *(long *)(lVar5 + (long)ppServerPorts * 8) != 0;
          ppServerPorts = (char **)((long)ppServerPorts + 1)) {
        uVar2 = *(undefined8 *)(lVar5 + (long)ppServerPorts * 8);
        uVar6 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_format)
                          (*(undefined8 *)((long)&pDevice->field_23 + (long)ppServerPorts * 8 + 8));
        iVar3 = (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_periods_near)
                          ((pDevice->field_23).alsa.pPCMPlayback,uVar6,uVar2);
        if (iVar3 != 0) {
          (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
          (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
          mVar4 = ma_post_error(pDevice,1,"[JACK] Failed to connect ports.",-1);
          return mVar4;
        }
      }
      (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(lVar5);
    }
    pDevice_local._4_4_ = 0;
  }
  else {
    pDevice_local._4_4_ =
         ma_post_error(pDevice,1,"[JACK] Failed to activate the JACK client.",-0x12e);
  }
  return pDevice_local._4_4_;
}

Assistant:

static ma_result ma_device_start__jack(ma_device* pDevice)
{
    ma_context* pContext = pDevice->pContext;
    int resultJACK;
    size_t i;

    resultJACK = ((ma_jack_activate_proc)pContext->jack.jack_activate)((ma_jack_client_t*)pDevice->jack.pClient);
    if (resultJACK != 0) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to activate the JACK client.", MA_FAILED_TO_START_BACKEND_DEVICE);
    }

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        const char** ppServerPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pDevice->jack.pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ma_JackPortIsOutput);
        if (ppServerPorts == NULL) {
            ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to retrieve physical ports.", MA_ERROR);
        }

        for (i = 0; ppServerPorts[i] != NULL; ++i) {
            const char* pServerPort = ppServerPorts[i];
            const char* pClientPort = ((ma_jack_port_name_proc)pContext->jack.jack_port_name)((ma_jack_port_t*)pDevice->jack.pPortsCapture[i]);

            resultJACK = ((ma_jack_connect_proc)pContext->jack.jack_connect)((ma_jack_client_t*)pDevice->jack.pClient, pServerPort, pClientPort);
            if (resultJACK != 0) {
                ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
                ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to connect ports.", MA_ERROR);
            }
        }

        ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
    }
    
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        const char** ppServerPorts = ((ma_jack_get_ports_proc)pContext->jack.jack_get_ports)((ma_jack_client_t*)pDevice->jack.pClient, NULL, MA_JACK_DEFAULT_AUDIO_TYPE, ma_JackPortIsPhysical | ma_JackPortIsInput);
        if (ppServerPorts == NULL) {
            ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to retrieve physical ports.", MA_ERROR);
        }

        for (i = 0; ppServerPorts[i] != NULL; ++i) {
            const char* pServerPort = ppServerPorts[i];
            const char* pClientPort = ((ma_jack_port_name_proc)pContext->jack.jack_port_name)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[i]);

            resultJACK = ((ma_jack_connect_proc)pContext->jack.jack_connect)((ma_jack_client_t*)pDevice->jack.pClient, pClientPort, pServerPort);
            if (resultJACK != 0) {
                ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
                ((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient);
                return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] Failed to connect ports.", MA_ERROR);
            }
        }

        ((ma_jack_free_proc)pContext->jack.jack_free)((void*)ppServerPorts);
    }

    return MA_SUCCESS;
}